

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

void __thiscall ncnn::Requantize::Requantize(Requantize *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Requantize_009f5b08;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1c));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x25));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2e));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x37));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Requantize::Requantize()
{
    one_blob_only = true;
    support_inplace = false;
}